

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O2

bool __thiscall sshash::map::save(map *this,string *filename)

{
  locale local_20 [8];
  
  std::locale::locale(local_20);
  boost::property_tree::json_parser::
  write_json<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            (filename,&this->super_ptree,local_20,true);
  std::locale::~locale(local_20);
  return true;
}

Assistant:

bool map::save(const std::string& filename)
{
	namespace jsp = boost::property_tree::json_parser;
	try
	{
		parent &p = *this;
		jsp::write_json(filename, p);
	}
	catch (std::exception &e)
	{
		std::cerr << "Failed to write config: " << e.what() << "\n";
		return false;
	}
	return true;
}